

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeCopMemInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t Val;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t RegNo;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  uint U;
  uint Rn;
  uint imm;
  uint coproc;
  uint CRd;
  uint pred;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  CRd = 3;
  _pred = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  Val = fieldFromInstruction_4(Insn,0x1c,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  U = fieldFromInstruction_4(Address_local._4_4_,0,8);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x17,1);
  uVar5 = MCInst_getOpcode(pMStack_18);
  if (((((uVar5 - 0x86 < 8) || (uVar5 - 0x186 < 8)) || (uVar5 - 0x935 < 8)) || (uVar5 - 0xa14 < 8))
     && ((uVar3 == 10 || (uVar3 == 0xb)))) {
    return MCDisassembler_Fail;
  }
  MCOperand_CreateImm0(pMStack_18,(ulong)uVar3);
  MCOperand_CreateImm0(pMStack_18,(ulong)uVar2);
  DVar6 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_pred);
  _Var1 = Check(&CRd,DVar6);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
  uVar5 = MCInst_getOpcode(pMStack_18);
  if (uVar5 == 0x7e) {
LAB_00168060:
    uVar5 = ARM_AM_getAM5Opc((uint)(uVar4 != 0),(uchar)U);
    MCOperand_CreateImm0(pMStack_18,(ulong)uVar5);
  }
  else {
    if (uVar5 == 0x80) {
LAB_0016808e:
      U = uVar4 << 8 | U;
    }
    else {
      if (uVar5 - 0x81 < 2) goto LAB_00168060;
      if (uVar5 == 0x84) goto LAB_0016808e;
      if (uVar5 - 0x85 < 2) goto LAB_00168060;
      if (uVar5 == 0x88) goto LAB_0016808e;
      if (uVar5 - 0x89 < 2) goto LAB_00168060;
      if (uVar5 == 0x8c) goto LAB_0016808e;
      if ((uVar5 == 0x8d) || (uVar5 == 0x17e)) goto LAB_00168060;
      if (uVar5 == 0x180) goto LAB_0016808e;
      if (uVar5 - 0x181 < 2) goto LAB_00168060;
      if (uVar5 == 0x184) goto LAB_0016808e;
      if (uVar5 - 0x185 < 2) goto LAB_00168060;
      if (uVar5 == 0x188) goto LAB_0016808e;
      if (uVar5 - 0x189 < 2) goto LAB_00168060;
      if (uVar5 == 0x18c) goto LAB_0016808e;
      if ((uVar5 == 0x18d) || (uVar5 == 0x92d)) goto LAB_00168060;
      if (uVar5 == 0x92f) goto LAB_0016808e;
      if (uVar5 - 0x930 < 2) goto LAB_00168060;
      if (uVar5 == 0x933) goto LAB_0016808e;
      if (uVar5 - 0x934 < 2) goto LAB_00168060;
      if (uVar5 == 0x937) goto LAB_0016808e;
      if (uVar5 - 0x938 < 2) goto LAB_00168060;
      if (uVar5 == 0x93b) goto LAB_0016808e;
      if ((uVar5 == 0x93c) || (uVar5 == 0xa0c)) goto LAB_00168060;
      if (uVar5 == 0xa0e) goto LAB_0016808e;
      if (uVar5 - 0xa0f < 2) goto LAB_00168060;
      if (uVar5 == 0xa12) goto LAB_0016808e;
      if (uVar5 - 0xa13 < 2) goto LAB_00168060;
      if (uVar5 == 0xa16) goto LAB_0016808e;
      if (uVar5 - 0xa17 < 2) goto LAB_00168060;
      if (uVar5 == 0xa1a) goto LAB_0016808e;
      if (uVar5 == 0xa1b) goto LAB_00168060;
    }
    MCOperand_CreateImm0(pMStack_18,(ulong)U);
  }
  uVar5 = MCInst_getOpcode(pMStack_18);
  if ((uVar5 - 0x86 < 8) || (uVar5 - 0x186 < 8)) {
    DVar6 = DecodePredicateOperand(pMStack_18,Val,(uint64_t)Decoder_local,_pred);
    _Var1 = Check(&CRd,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  return CRd;
}

Assistant:

static DecodeStatus DecodeCopMemInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned CRd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned coproc = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDC_POST:
		case ARM_t2LDC_OPTION:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDCL_PRE:
		case ARM_t2LDCL_POST:
		case ARM_t2LDCL_OPTION:
		case ARM_t2STC_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STC_POST:
		case ARM_t2STC_OPTION:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STCL_PRE:
		case ARM_t2STCL_POST:
		case ARM_t2STCL_OPTION:
			if (coproc == 0xA || coproc == 0xB)
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	MCOperand_CreateImm0(Inst, coproc);
	MCOperand_CreateImm0(Inst, CRd);
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2LDC2_OFFSET:
		case ARM_t2LDC2L_OFFSET:
		case ARM_t2LDC2_PRE:
		case ARM_t2LDC2L_PRE:
		case ARM_t2STC2_OFFSET:
		case ARM_t2STC2L_OFFSET:
		case ARM_t2STC2_PRE:
		case ARM_t2STC2L_PRE:
		case ARM_LDC2_OFFSET:
		case ARM_LDC2L_OFFSET:
		case ARM_LDC2_PRE:
		case ARM_LDC2L_PRE:
		case ARM_STC2_OFFSET:
		case ARM_STC2L_OFFSET:
		case ARM_STC2_PRE:
		case ARM_STC2L_PRE:
		case ARM_t2LDC_OFFSET:
		case ARM_t2LDCL_OFFSET:
		case ARM_t2LDC_PRE:
		case ARM_t2LDCL_PRE:
		case ARM_t2STC_OFFSET:
		case ARM_t2STCL_OFFSET:
		case ARM_t2STC_PRE:
		case ARM_t2STCL_PRE:
		case ARM_LDC_OFFSET:
		case ARM_LDCL_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDCL_PRE:
		case ARM_STC_OFFSET:
		case ARM_STCL_OFFSET:
		case ARM_STC_PRE:
		case ARM_STCL_PRE:
			imm = ARM_AM_getAM5Opc(U ? ARM_AM_add : ARM_AM_sub, (unsigned char)imm);
			MCOperand_CreateImm0(Inst, imm);
			break;
		case ARM_t2LDC2_POST:
		case ARM_t2LDC2L_POST:
		case ARM_t2STC2_POST:
		case ARM_t2STC2L_POST:
		case ARM_LDC2_POST:
		case ARM_LDC2L_POST:
		case ARM_STC2_POST:
		case ARM_STC2L_POST:
		case ARM_t2LDC_POST:
		case ARM_t2LDCL_POST:
		case ARM_t2STC_POST:
		case ARM_t2STCL_POST:
		case ARM_LDC_POST:
		case ARM_LDCL_POST:
		case ARM_STC_POST:
		case ARM_STCL_POST:
			imm |= U << 8;
			// fall through.
		default:
			// The 'option' variant doesn't encode 'U' in the immediate since
			// the immediate is unsigned [0,255].
			MCOperand_CreateImm0(Inst, imm);
			break;
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_LDC_OFFSET:
		case ARM_LDC_PRE:
		case ARM_LDC_POST:
		case ARM_LDC_OPTION:
		case ARM_LDCL_OFFSET:
		case ARM_LDCL_PRE:
		case ARM_LDCL_POST:
		case ARM_LDCL_OPTION:
		case ARM_STC_OFFSET:
		case ARM_STC_PRE:
		case ARM_STC_POST:
		case ARM_STC_OPTION:
		case ARM_STCL_OFFSET:
		case ARM_STCL_PRE:
		case ARM_STCL_POST:
		case ARM_STCL_OPTION:
			if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}